

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O1

bool __thiscall SubCircuit<4>::propagateSCC(SubCircuit<4> *this,int root)

{
  vec<int> *pvVar1;
  int *piVar2;
  IntVar *pIVar3;
  Clause *pCVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  Lit LVar8;
  uint uVar9;
  long lVar10;
  Tchar *pTVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  vec<int> *pvVar16;
  IntView<4> *pIVar17;
  vec<int> *other;
  ulong uVar18;
  IntVar *pIVar19;
  undefined1 reason [8];
  vec<int> thisSubtree;
  vec<int> prev_later;
  vec<int> alloutside;
  vec<int> prev_this_later;
  int backto;
  int backfrom;
  int numback;
  vec<int> this_later;
  vec<int> local_2a8;
  undefined1 local_298 [8];
  undefined8 uStack_290;
  bool local_288;
  vec<int> local_278;
  vec<int> local_268;
  Clause *local_250;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  ulong local_238;
  int local_230;
  int local_22c;
  vec<int> local_228;
  long local_218;
  ulong local_210;
  IntVar *local_208;
  Clause *local_200;
  int local_1f4;
  int **local_1f0;
  vec<int> *local_1e8;
  vec<SubCircuit<4>::PROP> *local_1e0;
  vec<int> local_178;
  vec<int> local_168;
  vec<int> local_158;
  vec<int> local_148;
  vec<int> local_138;
  vec<int> local_128;
  vec<int> local_118;
  vec<int> local_108;
  vec<int> local_f8;
  vec<int> local_e8;
  vec<int> local_d8;
  vec<int> local_c8;
  vec<int> local_b8;
  vec<int> local_a8;
  IntView<4> *local_98;
  vec<int> local_90;
  vec<int> local_80;
  vec<int> local_70;
  vec<int> local_60;
  ulong local_50;
  vec<int> *local_48;
  vec<int> local_40;
  
  local_23c = 0;
  local_240 = 0;
  local_22c = 0;
  local_2a8.sz = 0;
  local_2a8.cap = 0;
  local_2a8.data = (int *)0x0;
  local_244 = root;
  vec<int>::reserve(&local_2a8,*(uint *)&(this->super_Propagator).field_0x14);
  other = &this->prev;
  if ((this->prev).data != (int *)0x0) {
    other->sz = 0;
  }
  local_1e8 = &this->earlier;
  if ((this->earlier).data != (int *)0x0) {
    local_1e8->sz = 0;
  }
  pvVar1 = &this->later;
  if ((this->later).data != (int *)0x0) {
    pvVar1->sz = 0;
  }
  if (0 < *(int *)&(this->super_Propagator).field_0x14) {
    piVar2 = this->index;
    lVar10 = 0;
    do {
      piVar2[lVar10] = -1;
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)&(this->super_Propagator).field_0x14);
  }
  this->index[local_244] = 0;
  this->lowlink[local_244] = 0;
  this->nodesSeen = 1;
  local_1e0 = &this->propQueue;
  if ((this->propQueue).data != (PROP *)0x0) {
    local_1e0->sz = 0;
  }
  pIVar19 = this->x[local_244].var;
  iVar7 = (pIVar19->min).v;
  pIVar17 = this->x + local_244;
  local_238 = 0;
  local_1f0 = &local_168.data;
  local_230 = 0;
  local_208 = pIVar19;
  local_98 = pIVar17;
  do {
    iVar5 = local_230;
    lVar10 = (long)iVar7;
    lVar15 = pIVar17->b + lVar10;
    bVar6 = true;
    iVar13 = iVar7;
    if (this->index[lVar15] == -1) {
      local_22c = 0;
      local_218 = lVar10;
      local_1f4 = iVar7;
      bVar6 = exploreSubtree(this,(int)lVar15,(int)local_238,local_230,&local_23c,&local_240,
                             &local_22c);
      if (bVar6) {
        if (local_2a8.data != (int *)0x0) {
          local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
        }
        if ((this->later).data != (int *)0x0) {
          pvVar1->sz = 0;
        }
        local_298 = (undefined1  [8])((ulong)local_298 & 0xffffffff00000000);
        if (0 < *(int *)&(this->super_Propagator).field_0x14) {
          iVar7 = 0;
          do {
            pvVar16 = pvVar1;
            if ((this->index[iVar7] < 0) || (pvVar16 = &local_2a8, iVar5 < this->index[iVar7])) {
              vec<int>::push(pvVar16,(int *)local_298);
            }
            iVar7 = local_298._0_4_ + 1;
            local_298._0_4_ = iVar7;
          } while (iVar7 < *(int *)&(this->super_Propagator).field_0x14);
        }
        uVar18 = local_2a8._0_8_ & 0xffffffff;
        local_a8.sz = local_2a8.sz;
        local_a8.cap = local_2a8.sz;
        local_a8.data = (int *)malloc(uVar18 * 4);
        if (uVar18 != 0) {
          uVar14 = 0;
          do {
            local_a8.data[uVar14] = local_2a8.data[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar18 != uVar14);
        }
        LVar8 = getEvidenceLit(this,&local_a8);
        pIVar19 = local_208;
        local_250 = (Clause *)CONCAT44(local_250._4_4_,LVar8.x);
        if (local_a8.data != (int *)0x0) {
          free(local_a8.data);
        }
        local_a8.data = (int *)0x0;
        vec<int>::vec<int>(&local_60,other);
        LVar8 = getEvidenceLit(this,&local_60);
        if (local_60.data != (int *)0x0) {
          free(local_60.data);
        }
        local_60.data = (int *)0x0;
        local_278.sz = 0;
        local_278.cap = 0;
        local_278.data = (int *)0x0;
        if (other->sz == 0) {
          if (pvVar1->sz != 0) {
            lVar10 = 0;
            uVar18 = 0;
            do {
              vec<int>::push(&local_278,(int *)((long)(this->later).data + lVar10));
              uVar18 = uVar18 + 1;
              lVar10 = lVar10 + 4;
            } while (uVar18 < (this->later).sz);
          }
          vec<int>::push(&local_278,&local_244);
          uVar18 = local_278._0_8_ & 0xffffffff;
          local_b8.sz = local_278.sz;
          local_b8.cap = local_278.sz;
          local_b8.data = (int *)malloc(uVar18 * 4);
          if (uVar18 != 0) {
            uVar14 = 0;
            do {
              local_b8.data[uVar14] = local_278.data[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar18 != uVar14);
          }
          LVar8 = getEvidenceLit(this,&local_b8);
          pIVar19 = local_208;
          if (local_b8.data != (int *)0x0) {
            free(local_b8.data);
          }
          local_b8.data = (int *)0x0;
        }
        if (LVar8.x == 1 || (uint)local_250 == 1) {
LAB_001473bd:
          pvVar16 = local_1e8;
          if (other->sz != 0) {
            lVar10 = 0;
            uVar18 = 0;
            do {
              vec<int>::push(pvVar16,(int *)((long)(this->prev).data + lVar10));
              uVar18 = uVar18 + 1;
              lVar10 = lVar10 + 4;
            } while (uVar18 < (this->prev).sz);
          }
          if ((this->prev).data != (int *)0x0) {
            other->sz = 0;
          }
          if (local_2a8.sz != 0) {
            lVar10 = 0;
            uVar18 = 0;
            do {
              vec<int>::push(other,(int *)((long)local_2a8.data + lVar10));
              uVar18 = uVar18 + 1;
              lVar10 = lVar10 + 4;
            } while (uVar18 < (local_2a8._0_8_ & 0xffffffff));
          }
          local_238 = (ulong)(local_230 + 1);
          local_230 = this->nodesSeen + -1;
          bVar6 = true;
          pIVar19 = local_208;
        }
        else {
          if (local_22c != 0) {
            if ((local_22c == 1) && (this->fixReq != false)) {
              if (so.lazy == true) {
                if (other->sz == 0) {
                  iVar7 = local_278.sz * local_2a8.sz + 2;
                  local_248 = LVar8.x;
                  local_298 = (undefined1  [8])malloc((long)iVar7 * 4 + 8);
                  *(uint *)local_298 = (*(uint *)local_298 & 0xfc) + iVar7 * 0x100 + 2;
                  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_298);
                  reason = local_298;
                  if (*(uint *)local_298 < 0x200) goto LAB_00147bcc;
                  *(uint *)((long)local_298 + 8) = (uint)local_250;
                  if (*(uint *)local_298 < 0x300) goto LAB_00147bcc;
                  ((Clause *)((long)local_298 + 8))->data[0].x = local_248;
                  uVar18 = local_2a8._0_8_ & 0xffffffff;
                  local_128.sz = local_2a8.sz;
                  local_128.cap = local_2a8.sz;
                  local_128.data = (int *)malloc(uVar18 * 4);
                  if (uVar18 != 0) {
                    uVar14 = 0;
                    do {
                      local_128.data[uVar14] = local_2a8.data[uVar14];
                      uVar14 = uVar14 + 1;
                    } while (uVar18 != uVar14);
                  }
                  uVar18 = local_278._0_8_ & 0xffffffff;
                  local_138.sz = local_278.sz;
                  local_138.cap = local_278.sz;
                  local_138.data = (int *)malloc(uVar18 * 4);
                  if (uVar18 != 0) {
                    uVar14 = 0;
                    do {
                      local_138.data[uVar14] = local_278.data[uVar14];
                      uVar14 = uVar14 + 1;
                    } while (uVar18 != uVar14);
                  }
                  explainAcantreachB(this,(Clause *)reason,3,&local_128,&local_138,local_23c,
                                     local_240);
                  if (local_138.data != (int *)0x0) {
                    free(local_138.data);
                  }
                  local_138.data = (int *)0x0;
                  if (local_128.data != (int *)0x0) {
                    free(local_128.data);
                  }
                  local_128.data = (int *)0x0;
                }
                else {
                  local_298 = (undefined1  [8])0x0;
                  uStack_290 = (int *)0x0;
                  local_248 = LVar8.x;
                  if (other->sz != 0) {
                    lVar10 = 0;
                    uVar18 = 0;
                    do {
                      vec<int>::push((vec<int> *)local_298,(int *)((long)(this->prev).data + lVar10)
                                    );
                      uVar18 = uVar18 + 1;
                      lVar10 = lVar10 + 4;
                    } while (uVar18 < (this->prev).sz);
                  }
                  if (pvVar1->sz != 0) {
                    lVar10 = 0;
                    uVar18 = 0;
                    do {
                      vec<int>::push((vec<int> *)local_298,
                                     (int *)((long)(this->later).data + lVar10));
                      uVar18 = uVar18 + 1;
                      lVar10 = lVar10 + 4;
                    } while (uVar18 < (this->later).sz);
                  }
                  local_268.sz = 0;
                  local_268.cap = 0;
                  local_268.data = (int *)0x0;
                  if (local_298._0_4_ != 0) {
                    lVar10 = 0;
                    uVar18 = 0;
                    do {
                      vec<int>::push(&local_268,(int *)((long)uStack_290 + lVar10));
                      uVar18 = uVar18 + 1;
                      lVar10 = lVar10 + 4;
                    } while (uVar18 < ((ulong)local_298 & 0xffffffff));
                  }
                  if (local_2a8.sz != 0) {
                    lVar10 = 0;
                    uVar18 = 0;
                    do {
                      vec<int>::push(&local_268,(int *)((long)local_2a8.data + lVar10));
                      uVar18 = uVar18 + 1;
                      lVar10 = lVar10 + 4;
                    } while (uVar18 < (local_2a8._0_8_ & 0xffffffff));
                  }
                  local_228.sz = 0;
                  local_228.cap = 0;
                  local_228.data = (int *)0x0;
                  if (local_2a8.sz != 0) {
                    lVar10 = 0;
                    uVar18 = 0;
                    do {
                      vec<int>::push(&local_228,(int *)((long)local_2a8.data + lVar10));
                      uVar18 = uVar18 + 1;
                      lVar10 = lVar10 + 4;
                    } while (uVar18 < (local_2a8._0_8_ & 0xffffffff));
                  }
                  if (pvVar1->sz != 0) {
                    lVar10 = 0;
                    uVar18 = 0;
                    do {
                      vec<int>::push(&local_228,(int *)((long)(this->later).data + lVar10));
                      uVar18 = uVar18 + 1;
                      lVar10 = lVar10 + 4;
                    } while (uVar18 < (this->later).sz);
                  }
                  pvVar16 = local_1e8;
                  uVar12 = local_268.sz * local_1e8->sz;
                  local_238 = (ulong)uVar12;
                  uVar9 = local_228.sz * other->sz;
                  local_210 = (ulong)uVar9;
                  iVar7 = local_298._0_4_ * local_2a8.sz + uVar9 + uVar12 + 2;
                  local_200 = (Clause *)malloc((long)iVar7 * 4 + 8);
                  *(uint *)local_200 = (*(uint *)local_200 & 0xfc) + iVar7 * 0x100 + 2;
                  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_200);
                  reason = (undefined1  [8])local_200;
                  if (*(uint *)local_200 < 0x200) goto LAB_00147bcc;
                  *(uint *)(local_200 + 1) = (uint)local_250;
                  if (*(uint *)local_200 < 0x300) goto LAB_00147bcc;
                  local_200[1].data[0].x = local_248;
                  vec<int>::vec<int>(&local_40,pvVar16);
                  uVar18 = local_268._0_8_ & 0xffffffff;
                  local_148.sz = local_268.sz;
                  local_148.cap = local_268.sz;
                  local_148.data = (int *)malloc(uVar18 * 4);
                  if (uVar18 != 0) {
                    uVar14 = 0;
                    do {
                      local_148.data[uVar14] = local_268.data[uVar14];
                      uVar14 = uVar14 + 1;
                    } while (uVar18 != uVar14);
                  }
                  explainAcantreachB(this,(Clause *)reason,3,&local_40,&local_148,-1,-1);
                  if (local_148.data != (int *)0x0) {
                    free(local_148.data);
                  }
                  local_148.data = (int *)0x0;
                  if (local_40.data != (int *)0x0) {
                    free(local_40.data);
                  }
                  local_40.data = (int *)0x0;
                  vec<int>::vec<int>(&local_70,other);
                  uVar18 = local_228._0_8_ & 0xffffffff;
                  local_158.sz = local_228.sz;
                  local_158.cap = local_228.sz;
                  local_158.data = (int *)malloc(uVar18 * 4);
                  if (uVar18 != 0) {
                    uVar14 = 0;
                    do {
                      local_158.data[uVar14] = local_228.data[uVar14];
                      uVar14 = uVar14 + 1;
                    } while (uVar18 != uVar14);
                  }
                  iVar7 = (int)local_238 + 3;
                  explainAcantreachB(this,(Clause *)reason,iVar7,&local_70,&local_158,-1,-1);
                  if (local_158.data != (int *)0x0) {
                    free(local_158.data);
                  }
                  local_158.data = (int *)0x0;
                  if (local_70.data != (int *)0x0) {
                    free(local_70.data);
                  }
                  local_70.data = (int *)0x0;
                  uVar18 = local_2a8._0_8_ & 0xffffffff;
                  local_168.sz = local_2a8.sz;
                  local_168.cap = local_2a8.sz;
                  local_168.data = (int *)malloc(uVar18 * 4);
                  if (uVar18 != 0) {
                    uVar14 = 0;
                    do {
                      local_168.data[uVar14] = local_2a8.data[uVar14];
                      uVar14 = uVar14 + 1;
                    } while (uVar18 != uVar14);
                  }
                  uVar18 = (ulong)local_298 & 0xffffffff;
                  local_178.sz = local_298._0_4_;
                  local_178.cap = local_298._0_4_;
                  local_178.data = (int *)malloc(uVar18 * 4);
                  if (uVar18 != 0) {
                    uVar14 = 0;
                    do {
                      local_178.data[uVar14] = uStack_290[uVar14];
                      uVar14 = uVar14 + 1;
                    } while (uVar18 != uVar14);
                  }
                  explainAcantreachB(this,(Clause *)reason,(int)local_210 + iVar7,&local_168,
                                     &local_178,local_23c,local_240);
                  if (local_178.data != (int *)0x0) {
                    free(local_178.data);
                  }
                  local_178.data = (int *)0x0;
                  if (local_168.data != (int *)0x0) {
                    free(local_168.data);
                  }
                  local_168.data = (int *)0x0;
                  if (local_228.data != (int *)0x0) {
                    free(local_228.data);
                  }
                  if (local_268.data != (int *)0x0) {
                    free(local_268.data);
                  }
                  if (uStack_290 != (int *)0x0) {
                    free(uStack_290);
                  }
                }
              }
              else {
                reason = (undefined1  [8])0x0;
              }
              uStack_290 = (int *)CONCAT44(local_240,local_23c);
              local_288 = true;
              local_298 = reason;
              vec<SubCircuit<4>::PROP>::push(local_1e0,(PROP *)local_298);
            }
            goto LAB_001473bd;
          }
          if (so.lazy == true) {
            if (other->sz == 0) {
              iVar7 = local_278.sz * local_2a8.sz + 2;
              local_248 = LVar8.x;
              local_298 = (undefined1  [8])malloc((long)iVar7 * 4 + 8);
              *(uint *)local_298 = (*(uint *)local_298 & 0xfc) + iVar7 * 0x100 + 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_298);
              if (*(uint *)local_298 < 0x200) goto LAB_00147bcc;
              *(uint *)((long)local_298 + 8) = (uint)local_250;
              if (*(uint *)local_298 < 0x300) goto LAB_00147bcc;
              local_250 = (Clause *)local_298;
              ((Clause *)((long)local_298 + 8))->data[0].x = local_248;
              uVar18 = local_2a8._0_8_ & 0xffffffff;
              local_c8.sz = local_2a8.sz;
              local_c8.cap = local_2a8.sz;
              local_c8.data = (int *)malloc(uVar18 * 4);
              pIVar19 = local_208;
              if (uVar18 != 0) {
                uVar14 = 0;
                do {
                  local_c8.data[uVar14] = local_2a8.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar18 != uVar14);
              }
              uVar18 = local_278._0_8_ & 0xffffffff;
              local_d8.sz = local_278.sz;
              local_d8.cap = local_278.sz;
              local_d8.data = (int *)malloc(uVar18 * 4);
              pCVar4 = local_250;
              if (uVar18 != 0) {
                uVar14 = 0;
                do {
                  local_d8.data[uVar14] = local_278.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar18 != uVar14);
              }
              explainAcantreachB(this,local_250,3,&local_c8,&local_d8,*local_2a8.data,
                                 *local_278.data);
              if (local_d8.data != (int *)0x0) {
                free(local_d8.data);
              }
              local_d8.data = (int *)0x0;
              if (local_c8.data != (int *)0x0) {
                free(local_c8.data);
              }
              local_c8.data = (int *)0x0;
              pIVar3 = this->x[*local_2a8.data].var;
              (*(pIVar3->super_Var).super_Branching._vptr_Branching[0x10])
                        (pIVar3,(long)*local_278.data - (long)this->x[*local_2a8.data].b,pCVar4,1);
            }
            else {
              local_298 = (undefined1  [8])0x0;
              uStack_290 = (int *)0x0;
              local_248 = LVar8.x;
              if (other->sz != 0) {
                lVar10 = 0;
                uVar18 = 0;
                do {
                  vec<int>::push((vec<int> *)local_298,(int *)((long)(this->prev).data + lVar10));
                  uVar18 = uVar18 + 1;
                  lVar10 = lVar10 + 4;
                } while (uVar18 < (this->prev).sz);
              }
              if (pvVar1->sz != 0) {
                lVar10 = 0;
                uVar18 = 0;
                do {
                  vec<int>::push((vec<int> *)local_298,(int *)((long)(this->later).data + lVar10));
                  uVar18 = uVar18 + 1;
                  lVar10 = lVar10 + 4;
                } while (uVar18 < (this->later).sz);
              }
              local_268.sz = 0;
              local_268.cap = 0;
              local_268.data = (int *)0x0;
              if (local_298._0_4_ != 0) {
                lVar10 = 0;
                uVar18 = 0;
                do {
                  vec<int>::push(&local_268,(int *)((long)uStack_290 + lVar10));
                  uVar18 = uVar18 + 1;
                  lVar10 = lVar10 + 4;
                } while (uVar18 < ((ulong)local_298 & 0xffffffff));
              }
              local_48 = other;
              if (local_2a8.sz != 0) {
                lVar10 = 0;
                uVar18 = 0;
                do {
                  vec<int>::push(&local_268,(int *)((long)local_2a8.data + lVar10));
                  uVar18 = uVar18 + 1;
                  lVar10 = lVar10 + 4;
                } while (uVar18 < (local_2a8._0_8_ & 0xffffffff));
              }
              local_228.sz = 0;
              local_228.cap = 0;
              local_228.data = (int *)0x0;
              if (local_2a8.sz != 0) {
                lVar10 = 0;
                uVar18 = 0;
                do {
                  vec<int>::push(&local_228,(int *)((long)local_2a8.data + lVar10));
                  uVar18 = uVar18 + 1;
                  lVar10 = lVar10 + 4;
                } while (uVar18 < (local_2a8._0_8_ & 0xffffffff));
              }
              if (pvVar1->sz != 0) {
                lVar10 = 0;
                uVar18 = 0;
                do {
                  vec<int>::push(&local_228,(int *)((long)(this->later).data + lVar10));
                  uVar18 = uVar18 + 1;
                  lVar10 = lVar10 + 4;
                } while (uVar18 < (this->later).sz);
              }
              other = local_48;
              pvVar16 = local_1e8;
              uVar12 = local_268.sz * local_1e8->sz;
              local_210 = (ulong)uVar12;
              uVar9 = local_228.sz * local_48->sz;
              local_50 = (ulong)uVar9;
              iVar7 = local_298._0_4_ * local_2a8.sz + uVar9 + uVar12 + 2;
              local_200 = (Clause *)malloc((long)iVar7 * 4 + 8);
              *(uint *)local_200 = (*(uint *)local_200 & 0xfc) + iVar7 * 0x100 + 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_200);
              pIVar19 = local_208;
              if (*(uint *)local_200 < 0x200) {
LAB_00147bcc:
                abort();
              }
              *(uint *)(local_200 + 1) = (uint)local_250;
              if (*(uint *)local_200 < 0x300) goto LAB_00147bcc;
              local_250 = local_200;
              local_200[1].data[0].x = local_248;
              vec<int>::vec<int>(&local_80,pvVar16);
              uVar18 = local_268._0_8_ & 0xffffffff;
              local_e8.sz = local_268.sz;
              local_e8.cap = local_268.sz;
              local_e8.data = (int *)malloc(uVar18 * 4);
              if (uVar18 != 0) {
                uVar14 = 0;
                do {
                  local_e8.data[uVar14] = local_268.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar18 != uVar14);
              }
              explainAcantreachB(this,local_250,3,&local_80,&local_e8,-1,-1);
              if (local_e8.data != (int *)0x0) {
                free(local_e8.data);
              }
              local_e8.data = (int *)0x0;
              if (local_80.data != (int *)0x0) {
                free(local_80.data);
              }
              local_80.data = (int *)0x0;
              vec<int>::vec<int>(&local_90,other);
              uVar18 = local_228._0_8_ & 0xffffffff;
              local_f8.sz = local_228.sz;
              local_f8.cap = local_228.sz;
              local_f8.data = (int *)malloc(uVar18 * 4);
              if (uVar18 != 0) {
                uVar14 = 0;
                do {
                  local_f8.data[uVar14] = local_228.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar18 != uVar14);
              }
              uVar9 = (int)local_210 + 3;
              explainAcantreachB(this,local_250,uVar9,&local_90,&local_f8,-1,-1);
              if (local_f8.data != (int *)0x0) {
                free(local_f8.data);
              }
              local_f8.data = (int *)0x0;
              local_210 = (ulong)uVar9;
              if (local_90.data != (int *)0x0) {
                free(local_90.data);
              }
              local_90.data = (int *)0x0;
              uVar18 = local_2a8._0_8_ & 0xffffffff;
              local_108.sz = local_2a8.sz;
              local_108.cap = local_2a8.sz;
              local_108.data = (int *)malloc(uVar18 * 4);
              if (uVar18 != 0) {
                uVar14 = 0;
                do {
                  local_108.data[uVar14] = local_2a8.data[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar18 != uVar14);
              }
              uVar18 = (ulong)local_298 & 0xffffffff;
              local_118.sz = local_298._0_4_;
              local_118.cap = local_298._0_4_;
              local_118.data = (int *)malloc(uVar18 * 4);
              if (uVar18 != 0) {
                uVar14 = 0;
                do {
                  local_118.data[uVar14] = uStack_290[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar18 != uVar14);
              }
              explainAcantreachB(this,local_250,(int)local_50 + (int)local_210,&local_108,&local_118
                                 ,*local_2a8.data,*uStack_290);
              if (local_118.data != (int *)0x0) {
                free(local_118.data);
              }
              local_118.data = (int *)0x0;
              if (local_108.data != (int *)0x0) {
                free(local_108.data);
              }
              local_108.data = (int *)0x0;
              pIVar3 = this->x[*local_2a8.data].var;
              (*(pIVar3->super_Var).super_Branching._vptr_Branching[0x10])
                        (pIVar3,(long)*uStack_290 - (long)this->x[*local_2a8.data].b,local_250,1);
              if (local_228.data != (int *)0x0) {
                free(local_228.data);
              }
              if (local_268.data != (int *)0x0) {
                free(local_268.data);
              }
              if (uStack_290 != (int *)0x0) {
                free(uStack_290);
              }
            }
            bVar6 = false;
          }
          else {
            bVar6 = false;
          }
        }
        lVar10 = local_218;
        pIVar17 = local_98;
        iVar13 = local_1f4;
        if (local_278.data != (int *)0x0) {
          free(local_278.data);
          lVar10 = local_218;
          pIVar17 = local_98;
          iVar13 = local_1f4;
        }
      }
      else {
        bVar6 = false;
        lVar10 = local_218;
        pIVar17 = local_98;
        iVar13 = local_1f4;
      }
    }
    if (!bVar6) {
      if (local_2a8.data != (int *)0x0) {
        free(local_2a8.data);
      }
      return false;
    }
    iVar7 = -0x80000000;
    if (iVar13 != (pIVar19->max).v) {
      pTVar11 = pIVar19->vals + lVar10;
      iVar7 = iVar13;
      do {
        pTVar11 = pTVar11 + 1;
        iVar7 = iVar7 + 1;
      } while (pTVar11->v == '\0');
    }
  } while( true );
}

Assistant:

bool propagateSCC(int root) {
		int backfrom = 0;  // the last back edge found
		int backto = 0;
		int numback = 0;  // the number of back edges found

		vec<int> thisSubtree;

		thisSubtree.reserve(size);
		prev.clear();
		earlier.clear();
		later.clear();

		assert(!x[root].isFixed() || x[root].getVal() != root);
		for (int i = 0; i < size; i++) {
			index[i] = -1;  // unvisited
		}

		index[root] = 0;  // first node visited
		lowlink[root] = 0;

		nodesSeen = 1;  // only seen root node
		propQueue.clear();

		// original subtree is just the root node
		int startSubtree = 0;
		int endSubtree = 0;

		// explore children of the root node
		for (typename IntView<U>::iterator i = x[root].begin(); i != x[root].end(); ++i) {
			const int child = *i;

			if (index[child] == -1)  // if haven't explored this yet
			{
				numback = 0;
				if (!exploreSubtree(child, startSubtree, endSubtree, &backfrom, &backto, &numback)) {
					// fprintf(stderr, "failed in subtree\n");
					return false;  // fail if we found a scc within the child
				}

				// Find the nodes in the subtree we just explored and the ones still to be explored
				thisSubtree.clear();
				later.clear();
				for (int i = 0; i < size; i++) {
					if (index[i] < 0) {
						later.push(i);
					} else if (index[i] > endSubtree) {
						thisSubtree.push(i);
					}
				}

				const Lit evidenceThis = getEvidenceLit(thisSubtree);
				Lit evidenceOther = getEvidenceLit(prev);
				vec<int> alloutside;
				if (prev.size() == 0) {
					for (unsigned int i = 0; i < later.size(); i++) {
						alloutside.push(later[i]);
					}
					alloutside.push(root);
					evidenceOther = getEvidenceLit(alloutside);
				}

				if (evidenceThis != lit_True && evidenceOther != lit_True) {
					// If there's no edge from the new subtree back to the
					// previous one and both of these groups has
					// a variable definitely in, fail
					if (numback == 0) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.nobackedge++;
						if (so.lazy) {
							// If prev is empty then this is the first subtree,
							// and we just need to say that
							// the nodes in this subtree can't reach the
							// unexplored nodes or the root.
							// This is only a problem if something outside this subtree has to be in.
							if (prev.size() == 0) {
								Clause* r = Reason_new(thisSubtree.size() * alloutside.size() + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;
								// This subtree can't reach outside
								explainAcantreachB(r, 3, thisSubtree, alloutside, thisSubtree[0], alloutside[0]);
								x[thisSubtree[0]].setVal(alloutside[0], r);

								return false;
							}

							// Assuming we have at least one previous subtree,
							// the reason we're failing is that
							// 1. nodes in earlier subtrees can't reach the
							// previous one this one or unexplored ones,
							// 2. nodes in the previous subtree can't reach
							// this one or unexplored ones,
							// 3. and nodes in this subtree can't reach the
							// previous one or unexplored ones.
							vec<int> prev_later;
							for (unsigned int i = 0; i < prev.size(); i++) {
								prev_later.push(prev[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								prev_later.push(later[i]);
							}
							vec<int> prev_this_later;
							for (unsigned int i = 0; i < prev_later.size(); i++) {
								prev_this_later.push(prev_later[i]);
							}
							for (unsigned int i = 0; i < thisSubtree.size(); i++) {
								prev_this_later.push(thisSubtree[i]);
							}
							vec<int> this_later;
							for (unsigned int i = 0; i < thisSubtree.size(); i++) {
								this_later.push(thisSubtree[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								this_later.push(later[i]);
							}

							const int size1 = earlier.size() * prev_this_later.size();
							const int size2 = prev.size() * this_later.size();
							const int size3 = thisSubtree.size() * prev_later.size();
							assert(prev_later.size() > 0);
							Clause* r = Reason_new(size1 + size2 + size3 + 2);
							(*r)[1] = evidenceThis;
							(*r)[2] = evidenceOther;
							// 1. Earlier can't reach prev, this or later
							explainAcantreachB(r, 3, earlier, prev_this_later);

							// 2. Prev can't reach this or later
							explainAcantreachB(r, 3 + size1, prev, this_later);

							// 3. this can't reach prev or later
							explainAcantreachB(r, 3 + size1 + size2, thisSubtree, prev_later, thisSubtree[0],
																 prev_later[0]);
							x[thisSubtree[0]].setVal(prev_later[0], r);
						}
						return false;
					}

					// If there's only one, the back edge is required (only propagate if the option is set)
					if (fixReq && numback == 1) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.fixedBackedge++;
						Clause* r = nullptr;
						if (so.lazy) {
							// If this is the first subtree, the reason we're setting this link is that
							// there is no other link between nodes of this subtree to nodes outside the subtree
							// including the root
							if (prev.size() == 0) {
								r = Reason_new(thisSubtree.size() * alloutside.size() + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;
								// This subtree can't reach outside (except backfrom to backto)
								explainAcantreachB(r, 3, thisSubtree, alloutside, backfrom, backto);
							} else {
								// Otherwise we have at least one previous subtree.
								// The reason is the same as when failing above,
								// but we leave out the one we're setting
								vec<int> prev_later;
								for (unsigned int i = 0; i < prev.size(); i++) {
									prev_later.push(prev[i]);
								}
								for (unsigned int i = 0; i < later.size(); i++) {
									prev_later.push(later[i]);
								}
								vec<int> prev_this_later;
								for (unsigned int i = 0; i < prev_later.size(); i++) {
									prev_this_later.push(prev_later[i]);
								}
								for (unsigned int i = 0; i < thisSubtree.size(); i++) {
									prev_this_later.push(thisSubtree[i]);
								}
								vec<int> this_later;
								for (unsigned int i = 0; i < thisSubtree.size(); i++) {
									this_later.push(thisSubtree[i]);
								}
								for (unsigned int i = 0; i < later.size(); i++) {
									this_later.push(later[i]);
								}

								const int size1 = earlier.size() * prev_this_later.size();
								const int size2 = prev.size() * this_later.size();
								const int size3 = thisSubtree.size() * prev_later.size();
								r = Reason_new(size1 + size2 + size3 + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;

								// 1. Earlier can't reach prev, this or later
								explainAcantreachB(r, 3, earlier, prev_this_later);

								// 2. Prev can't reach this or later
								explainAcantreachB(r, 3 + size1, prev, this_later);

								// 3. this can't reach prev or unexplored (except for the one we're setting)
								explainAcantreachB(r, 3 + size1 + size2, thisSubtree, prev_later, backfrom, backto);
							}
						}

						addPropagation(true, backfrom, backto, r);
					}
				}

				// When a new subtree has been explored, update the prev and earlier vectors (only necessary
				// if explaining)
				for (unsigned int i = 0; i < prev.size(); i++) {
					earlier.push(prev[i]);
				}
				prev.clear();
				for (unsigned int i = 0; i < thisSubtree.size(); i++) {
					prev.push(thisSubtree[i]);
				}

				// Set the new subtree boundaries
				startSubtree = endSubtree + 1;
				endSubtree = nodesSeen - 1;
			}
		}

		// If we haven't reached all of the nodes and something we have reached has to
		// be included, then set everything outside to take its own index
		if (nodesSeen != size) {
			vec<int> seen;
			vec<int> notseen;

			for (int var = 0; var < size; var++) {
				if (index[var] >= 0) {
					seen.push(var);
				} else {
					notseen.push(var);
				}
			}
			const int numNotSeen = size - nodesSeen;
			assert(static_cast<int>(seen.size()) == nodesSeen);
			assert(static_cast<int>(notseen.size()) == numNotSeen);

			const Lit evidenceSeen = getEvidenceLit(seen);
			if (evidenceSeen != lit_True) {
				// XXX [AS] Commented following line, because propagator related statistics
				// should be collected within the propagator class.
				// engine.disconnected++;
				Clause* r = nullptr;

				if (so.lazy) {
					// need to say that each seen node doesn't reach any non-seen node
					r = Reason_new(nodesSeen * numNotSeen + 2);
					(*r)[1] = evidenceSeen;
					explainAcantreachB(r, 2, seen, notseen);
				}
				for (unsigned int i = 0; i < notseen.size(); i++) {
					const int outsideVar = notseen[i];
					if (x[outsideVar].setValNotR(outsideVar)) {
						if (!x[outsideVar].setVal(outsideVar, r)) {
							return false;
						}
					}
				}
			}
		}

		// If we're pruning root edges and there was more than one subtree, prune edges from the root to
		// earlier subtrees
		if (pruneRoot && startSubtree > 1) {
			// Check there's evidence
			// First find the nodes in the last subtree (and disconnected nodes) and those in the earlier
			// ones

			vec<int> lastSubtreeAndOutside;
			vec<int> earlierSubtree;
			for (int i = 0; i < size; i++) {
				if (index[i] >= startSubtree || index[i] < 0) {
					lastSubtreeAndOutside.push(i);
				} else if (index[i] > 0) {  // The root is considered in no subtree
					earlierSubtree.push(i);
				} else {
					assert(i == root);
				}
			}
			assert(earlierSubtree.size() > 0);
			assert(earlierSubtree.size() + lastSubtreeAndOutside.size() + 1 ==
						 static_cast<unsigned int>(size));
			const Lit evidenceLast = getEvidenceLit(lastSubtreeAndOutside);
			if (evidenceLast != lit_True) {
				// Build the reason if necessary (it will be the same for all of the pruned edges)
				Clause* r = nullptr;
				if (so.lazy) {
					// Reason should state that no var in an earlier sub tree reaches a var
					// in the last subtree or outside
					r = Reason_new(earlierSubtree.size() * lastSubtreeAndOutside.size() + 2);
					(*r)[1] = evidenceLast;
					explainAcantreachB(r, 2, earlierSubtree, lastSubtreeAndOutside);
				}

				// Prune all edges from the root to nodes in earlier subtrees
				for (int i = 0; i < size; i++) {
					if (i != root && index[i] < startSubtree) {
						addPropagation(false, root, i, r);
					}
				}

				/* for (typename IntView<U>::iterator i = x[root].begin(); i != x[root].end(); ++i)
				 {
						 if(*i != root && index[*i] < startSubtree)
						 {
								 // XXX [AS] Commented following line, because propagator related statistics
								 // should be collected within the propagator class.
								 //engine.prunedRoot++;
								 addPropagation(false, root, *i, r);
						 }
				 }*/
			}
		}

		// Perform the propagations
		for (unsigned int i = 0; i < propQueue.size(); i++) {
			PROP const p = propQueue[i];
			// fprintf(stderr, "propagating\n");
			if (p.fix) {
				if (x[p.var].setValNotR(p.val)) {
					if (!x[p.var].setVal(p.val, p.reason)) {
						return false;
					}
				}
			} else {
				if (x[p.var].remValNotR(p.val)) {
					if (!x[p.var].remVal(p.val, p.reason)) {
						return false;
					}
				}
			}
		}
		return true;
	}